

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::EigenDecompositionSquare
          (EigenDecompositionSquare<float,_1> *this,int decompositionCount,int stateCount,
          int categoryCount,long flags)

{
  int iVar1;
  float **ppfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  
  (this->super_EigenDecomposition<float,_1>).kEigenDecompCount = decompositionCount;
  (this->super_EigenDecomposition<float,_1>).kStateCount = stateCount;
  (this->super_EigenDecomposition<float,_1>).kCategoryCount = categoryCount;
  (this->super_EigenDecomposition<float,_1>).kFlags = flags;
  (this->super_EigenDecomposition<float,_1>)._vptr_EigenDecomposition =
       (_func_int **)&PTR__EigenDecompositionSquare_0014d710;
  uVar6 = ((uint)flags & 0x20) >> 5;
  this->isComplex = SUB41(uVar6,0);
  this->kEigenValuesSize = stateCount << uVar6;
  sVar8 = (long)decompositionCount << 3;
  ppfVar2 = (float **)malloc(sVar8);
  (this->super_EigenDecomposition<float,_1>).gEigenValues = ppfVar2;
  if (ppfVar2 != (float **)0x0) {
    ppfVar2 = (float **)malloc(sVar8);
    this->gEMatrices = ppfVar2;
    if (ppfVar2 != (float **)0x0) {
      ppfVar2 = (float **)malloc(sVar8);
      this->gIMatrices = ppfVar2;
      if (ppfVar2 != (float **)0x0) {
        lVar7 = (long)stateCount;
        if (0 < decompositionCount) {
          sVar8 = lVar7 * lVar7 * 4;
          iVar1 = this->kEigenValuesSize;
          uVar5 = 0;
          do {
            pfVar3 = (float *)malloc(sVar8);
            this->gEMatrices[uVar5] = pfVar3;
            if (this->gEMatrices[uVar5] == (float *)0x0) goto LAB_0013d80f;
            pfVar3 = (float *)malloc(sVar8);
            this->gIMatrices[uVar5] = pfVar3;
            if (this->gIMatrices[uVar5] == (float *)0x0) goto LAB_0013d80f;
            pfVar3 = (float *)malloc((long)iVar1 << 2);
            (this->super_EigenDecomposition<float,_1>).gEigenValues[uVar5] = pfVar3;
            if ((this->super_EigenDecomposition<float,_1>).gEigenValues[uVar5] == (float *)0x0)
            goto LAB_0013d80f;
            uVar5 = uVar5 + 1;
          } while ((uint)decompositionCount != uVar5);
        }
        pfVar3 = (float *)malloc(lVar7 * lVar7 * 4);
        (this->super_EigenDecomposition<float,_1>).matrixTmp = pfVar3;
        return;
      }
    }
  }
LAB_0013d80f:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = __cxa_init_primary_exception;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::EigenDecompositionSquare(int decompositionCount,
											       int stateCount,
											       int categoryCount,
											       long flags)
	: EigenDecomposition<BEAGLE_CPU_EIGEN_GENERIC>(decompositionCount,stateCount,categoryCount, flags) {

	isComplex = kFlags & BEAGLE_FLAG_EIGEN_COMPLEX;

	if (isComplex)
		kEigenValuesSize = 2 * kStateCount;
	else
		kEigenValuesSize = kStateCount;

    this->gEigenValues = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gEigenValues == NULL)
        throw std::bad_alloc();

    gEMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gEMatrices == NULL)
    	throw std::bad_alloc();

    gIMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
       if (gIMatrices == NULL)
       	throw std::bad_alloc();

    for (int i = 0; i < kEigenDecompCount; i++) {
    	gEMatrices[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
    	if (gEMatrices[i] == NULL)
    		throw std::bad_alloc();

    	gIMatrices[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
    	if (gIMatrices[i] == NULL)
    		throw std::bad_alloc();

    	gEigenValues[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kEigenValuesSize);
    	if (gEigenValues[i] == NULL)
    		throw std::bad_alloc();
    }

    matrixTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
}